

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketExtensions.h
# Opt level: O1

void __thiscall
uWS::ExtensionsParser::ExtensionsParser(ExtensionsParser *this,char *data,size_t length)

{
  int iVar1;
  char *local_30;
  
  this->serverMaxWindowBits = 0;
  this->clientMaxWindowBits = 0;
  this->lastInteger = (int *)0x0;
  *(undefined4 *)((long)&this->lastInteger + 7) = 0;
  iVar1 = 1;
  local_30 = data;
  while ((iVar1 != 0 && (iVar1 != 0x72e))) {
    iVar1 = getToken(this,&local_30,data + length);
  }
  this->perMessageDeflate = iVar1 == 0x72e;
LAB_00147959:
  do {
    while( true ) {
      iVar1 = getToken(this,&local_30,data + length);
      if (0x943 < iVar1) break;
      if (iVar1 == 0x92c) {
        this->clientMaxWindowBits = 1;
        this->lastInteger = &this->clientMaxWindowBits;
      }
      else {
        if ((iVar1 == 0) || (iVar1 == 0x72e)) {
          return;
        }
LAB_001479a9:
        if ((iVar1 < 0) && (this->lastInteger != (int *)0x0)) {
          *this->lastInteger = -iVar1;
        }
      }
    }
    if (iVar1 != 0x944) {
      if (iVar1 == 0xadf) {
        this->clientNoContextTakeover = true;
      }
      else {
        if (iVar1 != 0xaf7) goto LAB_001479a9;
        this->serverNoContextTakeover = true;
      }
      goto LAB_00147959;
    }
    this->serverMaxWindowBits = 1;
    this->lastInteger = &this->serverMaxWindowBits;
  } while( true );
}

Assistant:

ExtensionsParser(const char *data, size_t length) {
        const char *stop = data + length;
        int token = 1;
        for (; token && token != TOK_PERMESSAGE_DEFLATE; token = getToken(data, stop));

        perMessageDeflate = (token == TOK_PERMESSAGE_DEFLATE);
        while ((token = getToken(data, stop))) {
            switch (token) {
            case TOK_PERMESSAGE_DEFLATE:
                return;
            case TOK_SERVER_NO_CONTEXT_TAKEOVER:
                serverNoContextTakeover = true;
                break;
            case TOK_CLIENT_NO_CONTEXT_TAKEOVER:
                clientNoContextTakeover = true;
                break;
            case TOK_SERVER_MAX_WINDOW_BITS:
                serverMaxWindowBits = 1;
                lastInteger = &serverMaxWindowBits;
                break;
            case TOK_CLIENT_MAX_WINDOW_BITS:
                clientMaxWindowBits = 1;
                lastInteger = &clientMaxWindowBits;
                break;
            default:
                if (token < 0 && lastInteger) {
                    *lastInteger = -token;
                }
                break;
            }
        }
    }